

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

Parameters * __thiscall cnn::Model::add_parameters(Model *this,Dim *d,float scale)

{
  iterator __position;
  iterator __position_00;
  Parameters *this_00;
  Parameters *p;
  Parameters *local_30;
  float local_24;
  Parameters *local_20;
  
  local_24 = scale;
  this_00 = (Parameters *)operator_new(0xc0);
  Parameters::Parameters(this_00,d,local_24);
  __position._M_current = *(ParametersBase ***)(this + 8);
  local_30 = this_00;
  local_20 = this_00;
  if (__position._M_current == *(ParametersBase ***)(this + 0x10)) {
    std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
    _M_realloc_insert<cnn::ParametersBase*>
              ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,__position,
               (ParametersBase **)&local_20);
  }
  else {
    *__position._M_current = (ParametersBase *)this_00;
    *(long *)(this + 8) = *(long *)(this + 8) + 8;
  }
  __position_00._M_current = *(Parameters ***)(this + 0x20);
  if (__position_00._M_current == *(Parameters ***)(this + 0x28)) {
    std::vector<cnn::Parameters*,std::allocator<cnn::Parameters*>>::
    _M_realloc_insert<cnn::Parameters*const&>
              ((vector<cnn::Parameters*,std::allocator<cnn::Parameters*>> *)(this + 0x18),
               __position_00,&local_30);
  }
  else {
    *__position_00._M_current = local_30;
    *(long *)(this + 0x20) = *(long *)(this + 0x20) + 8;
  }
  return local_30;
}

Assistant:

Parameters* Model::add_parameters(const Dim& d, float scale) {
  Parameters* p = new Parameters(d, scale);
  all_params.push_back(p);
  params.push_back(p);
  return p;
}